

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vc1StreamReader.cpp
# Opt level: O2

void __thiscall
VC1StreamReader::updateStreamFps
          (VC1StreamReader *this,void *nalUnit,uint8_t *buff,uint8_t *nextNal,int oldSpsLen)

{
  uint8_t **ppuVar1;
  uint8_t *dst;
  size_t __n;
  int64_t sizeDiff;
  long lVar2;
  
  VC1SequenceHeader::setFPS(&this->m_sequence,(this->super_MPEGStreamReader).m_fps);
  dst = (uint8_t *)operator_new__((long)(oldSpsLen + 0x10));
  __n = VC1Unit::vc1_escape_buffer(&(this->m_sequence).super_VC1Unit,dst);
  lVar2 = __n - (long)oldSpsLen;
  if (lVar2 != 0) {
    memmove(nextNal + lVar2,nextNal,
            (long)(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd - (long)nextNal
           );
    ppuVar1 = &(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd;
    *ppuVar1 = *ppuVar1 + lVar2;
  }
  memcpy(buff + 1,dst,__n);
  operator_delete__(dst);
  return;
}

Assistant:

void VC1StreamReader::updateStreamFps(void* nalUnit, uint8_t* buff, uint8_t* nextNal, const int oldSpsLen)
{
    m_sequence.setFPS(m_fps);
    const auto tmpBuffer = new uint8_t[oldSpsLen + 16];
    const int64_t newSpsLen = m_sequence.vc1_escape_buffer(tmpBuffer);
    if (newSpsLen != oldSpsLen)
    {
        const int64_t sizeDiff = newSpsLen - oldSpsLen;
        memmove(nextNal + sizeDiff, nextNal, m_bufEnd - nextNal);
        m_bufEnd += sizeDiff;
    }
    memcpy(buff + 1, tmpBuffer, newSpsLen);
    delete[] tmpBuffer;
}